

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlInitialize(Fra_Sml_t *p,int fInit)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  int iVar4;
  int i;
  
  if (fInit == 0) {
    for (iVar4 = 0; p_00 = p->pAig->vCis, iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar4);
      Fra_SmlAssignRandom(p,pAVar1);
    }
  }
  else {
    pAVar2 = p->pAig;
    iVar4 = pAVar2->nRegs;
    if (iVar4 < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x196,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    iVar3 = pAVar2->nObjs[2];
    if (iVar3 <= iVar4) {
      __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x197,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    for (i = 0; iVar3 = iVar3 - iVar4, i < iVar3; i = i + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(pAVar2->vCis,i);
      Fra_SmlAssignRandom(p,pAVar1);
      pAVar2 = p->pAig;
      iVar4 = pAVar2->nRegs;
      iVar3 = pAVar2->nObjs[2];
    }
    for (; iVar3 < pAVar2->vCis->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(pAVar2->vCis,iVar3);
      Fra_SmlAssignConst(p,pAVar1,0,0);
      pAVar2 = p->pAig;
    }
  }
  return;
}

Assistant:

void Fra_SmlInitialize( Fra_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
    }
}